

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O0

void Timidity::mix_voice(Renderer *song,float *buf,Voice *v,int c)

{
  sample_t *psVar1;
  sample_t *sp;
  int count;
  int c_local;
  Voice *v_local;
  float *buf_local;
  Renderer *song_local;
  
  if (-1 < c) {
    sp._0_4_ = c;
    sp._4_4_ = c;
    _count = v;
    v_local = (Voice *)buf;
    buf_local = &song->rate;
    if ((v->status & 8) == 0) {
      psVar1 = resample_voice(song,v,(int *)&sp);
      if (-1 < (int)sp) {
        if ((_count->right_mix != 0.0) || (NAN(_count->right_mix))) {
          if ((_count->left_mix != 0.0) || (NAN(_count->left_mix))) {
            if (((_count->eg1).field_0.env.bUpdating == '\0') &&
               (_count->tremolo_phase_increment == 0)) {
              mix_mystery((SDWORD)buf_local[0xac],psVar1,(float *)v_local,_count,(int)sp);
            }
            else {
              mix_mystery_signal((SDWORD)buf_local[0xac],psVar1,(float *)v_local,_count,(int)sp);
            }
          }
          else if (((_count->eg1).field_0.env.bUpdating == '\0') &&
                  (_count->tremolo_phase_increment == 0)) {
            mix_single_right(psVar1,(float *)v_local,_count,(int)sp);
          }
          else {
            mix_single_right_signal((SDWORD)buf_local[0xac],psVar1,(float *)v_local,_count,(int)sp);
          }
        }
        else if (((_count->eg1).field_0.env.bUpdating == '\0') &&
                (_count->tremolo_phase_increment == 0)) {
          mix_single_left(psVar1,(float *)v_local,_count,(int)sp);
        }
        else {
          mix_single_left_signal((SDWORD)buf_local[0xac],psVar1,(float *)v_local,_count,(int)sp);
        }
        _count->sample_count = (int)sp + _count->sample_count;
      }
    }
    else {
      if (0x13 < c) {
        sp._0_4_ = 0x14;
      }
      psVar1 = resample_voice(song,v,(int *)&sp);
      ramp_out(psVar1,(float *)v_local,_count,(int)sp);
      _count->status = '\0';
    }
  }
  return;
}

Assistant:

void mix_voice(Renderer *song, float *buf, Voice *v, int c)
{
	int count = c;
	sample_t *sp;
	if (c < 0)
	{
		return;
	}
	if (v->status & VOICE_STOPPING)
	{
		if (count >= MAX_DIE_TIME)
			count = MAX_DIE_TIME;
		sp = resample_voice(song, v, &count);
		ramp_out(sp, buf, v, count);
		v->status = 0;
	}
	else
	{
		sp = resample_voice(song, v, &count);
		if (count < 0)
		{
			return;
		}
		if (v->right_mix == 0)			// All the way to the left
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment != 0)
			{
				mix_single_left_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_single_left(sp, buf, v, count);
			}
		}
		else if (v->left_mix == 0)		// All the way to the right
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment != 0)
			{
				mix_single_right_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_single_right(sp, buf, v, count);
			}
		}
		else							// Somewhere in the middle
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment)
			{
				mix_mystery_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_mystery(song->control_ratio, sp, buf, v, count);
			}
		}
		v->sample_count += count;
	}
}